

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::Timer(Timer *this,int tickTimeMs,bool stoppable)

{
  (this->super_RefCount).mRefCount = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_001309f8;
  this->mClockThread = (Runnable<Timer> *)0x0;
  this->mMsPerTick = tickTimeMs;
  this->mStoppable = stoppable;
  Mutex::Mutex(&this->mMutex,true);
  JetHead::list<Timer::TimerNode>::list(&this->mList);
  this->mTicks = 0;
  if (this->mMsPerTick < 0) {
    this->mMsPerTick = 100;
  }
  start(this);
  return;
}

Assistant:

Timer::Timer(int tickTimeMs, bool stoppable)
:	mClockThread(NULL),
	mMsPerTick(tickTimeMs),
	mStoppable(stoppable),
	mMutex(true),
	mTicks(0)
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	// If a negative tick time is specified then use 100ms
	if (mMsPerTick < 0)
		mMsPerTick = 100;
	
	// Start the timer thread running immediately
	start();
}